

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O0

uint256 * jbcoin::getSignerListIndex(uint256 *__return_storage_ptr__,AccountID *account)

{
  uint *in_R8;
  undefined1 local_18 [6];
  undefined2 local_12;
  AccountID *local_10;
  AccountID *account_local;
  
  local_12 = 0x53;
  local_18._0_4_ = 0;
  local_10 = account;
  sha512Half<unsigned_short,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,unsigned_int>
            (__return_storage_ptr__,(jbcoin *)&local_12,(unsigned_short *)account,
             (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)local_18,in_R8);
  return __return_storage_ptr__;
}

Assistant:

uint256
getSignerListIndex (AccountID const& account)
{
    // We are prepared for there to be multiple SignerLists in the future,
    // but we don't have them yet.  In anticipation of multiple SignerLists
    // We supply a 32-bit ID to locate the SignerList.  Until we actually
    // *have* multiple signer lists, we can default that ID to zero.
    return sha512Half(
        std::uint16_t(spaceSignerList),
        account,
        std::uint32_t (0));  // 0 == default SignerList ID.
}